

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O3

int ptls_fusion_aesgcm_decrypt
              (ptls_fusion_aesgcm_context_t *_ctx,void *output,void *input,size_t inlen,__m128i ctr,
              void *_aad,size_t aadlen,void *tag)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  undefined1 auVar4 [16];
  __m128i alVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  __m128i *palVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  undefined1 *puVar19;
  __m128i *palVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  size_t sVar30;
  size_t sVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  __m128i alVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  ulong uStack_140;
  undefined1 (*local_130) [16];
  undefined1 local_c8 [16];
  __m128i gdatabuf [6];
  uint8_t buf [16];
  ulong uVar31;
  
  auVar36 = _DAT_0012dce0;
  auVar6 = vpunpcklqdq_avx(ZEXT416((uint)((int)inlen * 8)),ZEXT416((uint)((int)ctr[1] * 8)));
  alVar5 = (__m128i)vpshufb_avx(auVar6,_DAT_0012dcd0);
  lVar21 = (inlen * 2 + 0x1e & 0xffffffffffffffe0) + (ctr[1] * 2 + 0x1eU & 0xffffffffffffffe0) +
           0x240;
  auVar4 = vpaddq_avx(in_ZMM0._0_16_,_DAT_0012dcf0);
  auVar39 = ZEXT1664(auVar4);
  auVar4 = vpshufb_avx(auVar4,_DAT_0012dce0);
  auVar37 = ZEXT1664(auVar4 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0]);
  bVar14 = true;
  bVar13 = true;
  lVar28 = 1;
  auVar52 = ZEXT1664((undefined1  [16])0x0);
  auVar4 = vpmovsxbq_avx(ZEXT216(1));
  auVar53 = ZEXT1664((undefined1  [16])0x0);
  auVar54 = ZEXT1664((undefined1  [16])0x0);
  auVar42 = ZEXT1664((undefined1  [16])0x0);
  auVar44 = ZEXT1664((undefined1  [16])0x0);
  auVar46 = ZEXT1664((undefined1  [16])0x0);
  auVar51 = ZEXT1664((undefined1  [16])0x0);
  auVar40 = ZEXT1664((undefined1  [16])0x0);
  local_c8 = (undefined1  [16])0x0;
  pauVar24 = (undefined1 (*) [16])input;
  sVar32 = inlen;
LAB_00109e21:
  uVar17 = (ulong)(_ctx->ecb).rounds;
  do {
    auVar48 = auVar39._0_16_;
    if (ctr[1] == 0) {
      local_130 = (undefined1 (*) [16])ctr[0];
      if (sVar32 < 0x60) {
        uVar27 = 0;
LAB_0010a1a2:
        uVar23 = (ulong)input & 0xffffffff;
        uVar22 = 0;
        uVar26 = uVar27;
        uVar31 = sVar32;
        do {
          uVar16 = uVar22;
          sVar30 = uVar31 - 0x10;
          if (uVar31 < 0x10) {
            palVar20 = (__m128i *)((long)*(__m128i *)input + uVar16);
            if (sVar32 != uVar16) {
              puVar19 = (undefined1 *)((long)*(__m128i *)input + uVar16);
              uVar18 = (uint)puVar19;
              if (((uVar18 & 0xfff) < 0xff1) ||
                 (0x1000 < (((uint)uVar23 & 0xfff) + sVar32) - uVar16)) {
                alVar47 = *palVar20;
              }
              else {
                alVar47 = (__m128i)vpshufb_avx(*(undefined1 (*) [16])
                                                ((ulong)puVar19 & 0xfffffffffffffff0),
                                               *(undefined1 (*) [16])("" + (uVar18 & 0xf)));
              }
              auVar34 = vpand_avx((undefined1  [16])alVar47,
                                  *(undefined1 (*) [16])(loadn_mask + uVar16 + (0x20 - sVar32)));
              uVar26 = uVar26 + 1;
              *(undefined1 (*) [16])((long)gdatabuf[uVar27] + uVar16) = auVar34;
              palVar20 = (__m128i *)((long)*palVar20 + uVar31);
            }
            if ((uVar26 < 6) && (bVar14)) {
              gdatabuf[uVar26] = alVar5;
              bVar14 = false;
              uVar26 = uVar26 + 1;
            }
            palVar15 = gdatabuf;
            sVar32 = 0;
            input = palVar20;
            goto LAB_00109e52;
          }
          puVar1 = (undefined8 *)((long)*(__m128i *)input + uVar16);
          uVar11 = puVar1[1];
          uVar26 = uVar26 + 1;
          puVar2 = (undefined8 *)((long)gdatabuf[uVar27] + uVar16);
          *puVar2 = *puVar1;
          puVar2[1] = uVar11;
          uVar23 = (ulong)((uint)uVar23 + 0x10);
          uVar22 = uVar16 + 0x10;
          uVar31 = sVar30;
        } while (uVar26 != 6);
        palVar15 = gdatabuf;
        uStack_140 = 6;
        input = (__m128i *)((long)*(__m128i *)((long)input + 0x10) + uVar16);
        uVar26 = uStack_140;
        sVar32 = sVar30;
      }
      else {
        palVar15 = (__m128i *)input;
        input = (__m128i *)((long)input + 0x60);
        uVar26 = 6;
        sVar32 = sVar32 - 0x60;
      }
LAB_00109e52:
      if (lVar28 != 0) {
        uVar27 = 0;
        goto LAB_0010a152;
      }
      auVar48 = vpaddq_avx(auVar48,auVar4);
      auVar34 = vpshufb_avx(auVar48,auVar36);
      alVar47 = *(__m128i *)&(_ctx->ecb).keys;
      auVar37 = ZEXT1664((undefined1  [16])alVar47 ^ auVar34);
      bVar12 = 1;
      uVar27 = 0;
      uStack_140 = 0;
LAB_00109e7a:
      auVar48 = vpaddq_avx(auVar48,auVar4);
      auVar34 = vpshufb_avx(auVar48,auVar36);
      auVar40 = ZEXT1664((undefined1  [16])alVar47 ^ auVar34);
LAB_00109e87:
      auVar48 = vpaddq_avx(auVar48,auVar4);
      auVar34 = vpshufb_avx(auVar48,auVar36);
      auVar42 = ZEXT1664((undefined1  [16])alVar47 ^ auVar34);
LAB_00109e94:
      auVar48 = vpaddq_avx(auVar48,auVar4);
      auVar34 = vpshufb_avx(auVar48,auVar36);
      auVar44 = ZEXT1664((undefined1  [16])alVar47 ^ auVar34);
LAB_00109ea1:
      auVar48 = vpaddq_avx(auVar48,auVar4);
      auVar34 = vpshufb_avx(auVar48,auVar36);
      auVar46 = ZEXT1664((undefined1  [16])alVar47 ^ auVar34);
LAB_00109eaf:
      auVar48 = vpaddq_avx(auVar48,auVar4);
      auVar39 = ZEXT1664(auVar48);
      auVar48 = vpshufb_avx(auVar48,auVar36);
      auVar51 = ZEXT1664((undefined1  [16])alVar47 ^ auVar48);
      ctr[1] = uVar27;
    }
    else {
      lVar29 = 0;
      uVar22 = 0;
      uVar26 = ctr[0] & 0xffffffff;
      uVar27 = ctr[1];
      do {
        bVar33 = uVar27 < 0x10;
        uVar27 = uVar27 - 0x10;
        if (bVar33) {
          local_130 = (undefined1 (*) [16])(*(undefined1 (*) [16])ctr[0] + uVar22);
          if (uVar22 == ctr[1]) {
            lVar28 = lVar28 - lVar29;
            uVar26 = -lVar29;
          }
          else {
            uVar18 = (uint)(*(undefined1 (*) [16])ctr[0] + uVar22);
            if (((uVar18 & 0xfff) < 0xff1) ||
               (0x1000 < ((ulong)((uint)uVar26 & 0xfff) + ctr[1]) - uVar22)) {
              auVar34 = *local_130;
            }
            else {
              auVar34 = vpshufb_avx(*(undefined1 (*) [16])
                                     ((ulong)(*(undefined1 (*) [16])ctr[0] + uVar22) &
                                     0xfffffffffffffff0),*(undefined1 (*) [16])("" + (uVar18 & 0xf))
                                   );
            }
            auVar34 = vpand_avx(auVar34,*(undefined1 (*) [16])
                                         (loadn_mask + uVar22 + (0x20 - ctr[1])));
            uVar26 = 1 - lVar29;
            *(undefined1 (*) [16])((long)gdatabuf[0] + uVar22) = auVar34;
            lVar28 = (lVar28 - lVar29) + 1;
          }
          uVar27 = uVar26;
          if (uVar26 < 6) goto LAB_0010a1a2;
          palVar15 = gdatabuf;
          goto LAB_00109e52;
        }
        uVar11 = *(undefined8 *)((long)(*(undefined1 (*) [16])ctr[0] + uVar22) + 8);
        *(undefined8 *)((long)gdatabuf[0] + uVar22) =
             *(undefined8 *)(*(undefined1 (*) [16])ctr[0] + uVar22);
        *(undefined8 *)((long)gdatabuf[0] + uVar22 + 8) = uVar11;
        uVar26 = (ulong)((uint)uVar26 + 0x10);
        uVar22 = uVar22 + 0x10;
        lVar29 = lVar29 + -1;
      } while (uVar22 != 0x60);
      lVar28 = lVar28 - lVar29;
      local_130 = (undefined1 (*) [16])(ctr[0] + 0x60);
      uVar26 = 6;
      palVar15 = gdatabuf;
LAB_0010a152:
      switch(lVar28) {
      case 1:
        alVar47 = *(__m128i *)&(_ctx->ecb).keys;
        bVar12 = 0;
        uStack_140 = 1;
        goto LAB_00109e7a;
      case 2:
        alVar47 = *(__m128i *)&(_ctx->ecb).keys;
        bVar12 = 0;
        uStack_140 = 2;
        goto LAB_00109e87;
      case 3:
        alVar47 = *(__m128i *)&(_ctx->ecb).keys;
        bVar12 = 0;
        uStack_140 = 3;
        goto LAB_00109e94;
      case 4:
        alVar47 = *(__m128i *)&(_ctx->ecb).keys;
        bVar12 = 0;
        uStack_140 = 4;
        goto LAB_00109ea1;
      case 5:
        alVar47 = (_ctx->ecb).keys.m128[0];
        bVar12 = 0;
        uStack_140 = 5;
        goto LAB_00109eaf;
      default:
        bVar12 = 0;
        uStack_140 = lVar28;
        ctr[1] = uVar27;
      }
    }
    if (uVar26 == 0) {
      uVar27 = 1;
    }
    else {
      uVar27 = uVar26 + 1;
      lVar28 = lVar21 + -0x10;
      lVar29 = 0x10;
      uVar22 = uVar26;
      do {
        auVar48 = *(undefined1 (*) [16])((long)&(_ctx->ecb).keys + lVar29);
        auVar34 = aesenc(auVar37._0_16_,auVar48);
        auVar37._0_32_ = ZEXT1632(auVar34);
        auVar34 = aesenc(auVar40._0_16_,auVar48);
        auVar40._0_32_ = ZEXT1632(auVar34);
        auVar34 = aesenc(auVar42._0_16_,auVar48);
        auVar42._0_32_ = ZEXT1632(auVar34);
        auVar34 = aesenc(auVar44._0_16_,auVar48);
        auVar44._0_32_ = ZEXT1632(auVar34);
        auVar34 = aesenc(auVar46._0_16_,auVar48);
        auVar46._0_32_ = ZEXT1632(auVar34);
        auVar48 = aesenc(auVar51._0_16_,auVar48);
        auVar51._0_32_ = ZEXT1632(auVar48);
        puVar3 = (ulong *)((long)_ctx + lVar28 + -0x10);
        auVar48 = vpshufb_avx(*(undefined1 (*) [16])((long)palVar15[-1] + lVar29),auVar36);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *puVar3;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auVar48._0_8_;
        auVar34 = (undefined1  [16])0x0;
        for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
          if ((auVar38 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
            auVar34 = auVar34 ^ auVar49 << uVar18;
          }
        }
        auVar53 = ZEXT1664(auVar34 ^ auVar53._0_16_);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = puVar3[1];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = auVar48._8_8_;
        auVar34 = (undefined1  [16])0x0;
        for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
          if ((auVar35 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
            auVar34 = auVar34 ^ auVar41 << uVar18;
          }
        }
        auVar54 = ZEXT1664(auVar34 ^ auVar54._0_16_);
        auVar34 = vpshufd_avx(auVar48,0xee);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = auVar34._0_8_ ^ auVar48._0_8_;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)((long)&(_ctx->ecb).keys + lVar28);
        auVar48 = (undefined1  [16])0x0;
        for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
          if ((auVar43 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
            auVar48 = auVar48 ^ auVar34 << uVar18;
          }
        }
        auVar52 = ZEXT1664(auVar48 ^ auVar52._0_16_);
        lVar29 = lVar29 + 0x10;
        lVar28 = lVar28 + -0x20;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
      lVar21 = lVar21 + uVar26 * -0x20;
    }
    auVar34 = auVar54._0_16_;
    auVar48 = auVar53._0_16_;
    auVar38 = auVar52._0_16_;
    if (uVar27 < uVar17) {
      lVar28 = (uVar17 - 1) - uVar26;
      pauVar25 = (undefined1 (*) [16])((long)&(_ctx->ecb).keys + uVar26 * 0x10 + 0x10);
      do {
        auVar49 = *pauVar25;
        auVar35 = aesenc(auVar37._0_16_,auVar49);
        auVar37._0_32_ = ZEXT1632(auVar35);
        auVar35 = aesenc(auVar40._0_16_,auVar49);
        auVar40._0_32_ = ZEXT1632(auVar35);
        auVar35 = aesenc(auVar42._0_16_,auVar49);
        auVar42._0_32_ = ZEXT1632(auVar35);
        auVar35 = aesenc(auVar44._0_16_,auVar49);
        auVar44._0_32_ = ZEXT1632(auVar35);
        auVar35 = aesenc(auVar46._0_16_,auVar49);
        auVar46._0_32_ = ZEXT1632(auVar35);
        auVar49 = aesenc(auVar51._0_16_,auVar49);
        auVar51._0_32_ = ZEXT1632(auVar49);
        pauVar25 = pauVar25 + 1;
        lVar28 = lVar28 + -1;
        uVar27 = uVar17;
      } while (lVar28 != 0);
    }
    alVar47 = (_ctx->ecb).keys.m128[uVar27];
    auVar49 = aesenclast(auVar37._0_16_,(undefined1  [16])alVar47);
    auVar37._0_32_ = ZEXT1632(auVar49);
    auVar35 = aesenclast(auVar40._0_16_,(undefined1  [16])alVar47);
    auVar40._0_32_ = ZEXT1632(auVar35);
    auVar41 = aesenclast(auVar42._0_16_,(undefined1  [16])alVar47);
    auVar42._0_32_ = ZEXT1632(auVar41);
    auVar43 = aesenclast(auVar44._0_16_,(undefined1  [16])alVar47);
    auVar44._0_32_ = ZEXT1632(auVar43);
    auVar45 = aesenclast(auVar46._0_16_,(undefined1  [16])alVar47);
    auVar46._0_32_ = ZEXT1632(auVar45);
    auVar50 = aesenclast(auVar51._0_16_,(undefined1  [16])alVar47);
    auVar51._0_32_ = ZEXT1632(auVar50);
    ctr[0] = (longlong)local_130;
    if ((bool)(bVar12 & 0x5f < inlen)) {
      *(undefined1 (*) [16])output = auVar49 ^ *pauVar24;
      *(undefined1 (*) [16])((long)output + 0x10) = auVar35 ^ pauVar24[1];
      *(undefined1 (*) [16])((long)output + 0x20) = auVar41 ^ pauVar24[2];
      *(undefined1 (*) [16])((long)output + 0x30) = auVar43 ^ pauVar24[3];
      *(undefined1 (*) [16])((long)output + 0x40) = auVar45 ^ pauVar24[4];
      *(undefined1 (*) [16])((long)output + 0x50) = auVar50 ^ pauVar24[5];
      output = (void *)((long)output + 0x60);
      pauVar24 = pauVar24 + 6;
      inlen = inlen - 0x60;
      lVar28 = 0;
      goto LAB_00109e21;
    }
    if (bVar13) {
      local_c8 = auVar49;
    }
    bVar13 = false;
    lVar28 = 0;
    switch(uStack_140) {
    case 0:
      goto switchD_0010a43c_caseD_0;
    case 1:
      goto switchD_0010a43c_caseD_1;
    case 2:
      goto switchD_0010a43c_caseD_2;
    case 3:
      goto switchD_0010a43c_caseD_3;
    case 4:
      goto switchD_0010a43c_caseD_4;
    case 5:
      goto switchD_0010a43c_caseD_5;
    }
  } while( true );
switchD_0010a43c_caseD_0:
  if (inlen < 0x11) {
LAB_0010a506:
    if (inlen != 0) {
      if (inlen == 0x10) {
        *(undefined1 (*) [16])output = auVar49 ^ *pauVar24;
      }
      else {
        uVar17 = (ulong)((uint)pauVar24 & 0xfff);
        if ((uVar17 < 0xff1) || (0x1000 < uVar17 + inlen)) {
          auVar4 = *pauVar24;
        }
        else {
          auVar4 = vpshufb_avx(*(undefined1 (*) [16])((ulong)pauVar24 & 0xfffffffffffffff0),
                               *(undefined1 (*) [16])("" + ((uint)pauVar24 & 0xf)));
        }
        auVar4 = vpand_avx(auVar4,*(undefined1 (*) [16])(loadn_mask + (0x20 - inlen)));
        buf = (uint8_t  [16])(auVar4 ^ auVar49);
        memcpy(output,buf,inlen);
      }
    }
    if (bVar14) {
      if (lVar21 != 0x240) {
        __assert_fail("ghash_precompute - 1 == ctx->ghash",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/fusion.c"
                      ,0x341,
                      "int ptls_fusion_aesgcm_decrypt(ptls_fusion_aesgcm_context_t *, void *, const void *, size_t, __m128i, const void *, size_t, const void *)"
                     );
      }
      auVar36._8_8_ = 0;
      auVar36._0_8_ = _ctx[1].ecb.keys.m128[0][0];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = auVar6._0_8_;
      auVar4 = (undefined1  [16])0x0;
      for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
        if ((auVar36 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
          auVar4 = auVar4 ^ auVar45 << uVar18;
        }
      }
      auVar50._8_8_ = 0;
      auVar50._0_8_ = _ctx[1].ecb.keys.m128[0][1];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auVar6._8_8_;
      auVar36 = (undefined1  [16])0x0;
      for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
        if ((auVar50 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
          auVar36 = auVar36 ^ auVar8 << uVar18;
        }
      }
      auVar49 = vpshufd_avx(auVar6,0xee);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar49._0_8_ ^ auVar6._0_8_;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = _ctx[1].ecb.keys.m128[1][0];
      auVar6 = (undefined1  [16])0x0;
      for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
        if ((auVar9 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
          auVar6 = auVar6 ^ auVar10 << uVar18;
        }
      }
      auVar48 = auVar48 ^ auVar4;
      auVar34 = auVar34 ^ auVar36;
      auVar38 = auVar38 ^ auVar6;
    }
    auVar4 = auVar34 ^ auVar48 ^ auVar38;
    auVar38 = vpslldq_avx(auVar4,8);
    auVar36 = vpsrldq_avx(auVar4,8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = SUB168(auVar48 ^ auVar38,0);
    auVar4 = (undefined1  [16])0x0;
    for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
      if ((auVar6 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
        auVar4 = auVar4 ^ ZEXT816(0xc200000000000000) << uVar18;
      }
    }
    auVar6 = vpshufd_avx(auVar48 ^ auVar38,0x4e);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SUB168(auVar4 ^ auVar6,0);
    auVar48 = (undefined1  [16])0x0;
    for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
      if ((auVar7 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
        auVar48 = auVar48 ^ ZEXT816(0xc200000000000000) << uVar18;
      }
    }
    auVar4 = vpshufd_avx(auVar4 ^ auVar6,0x4e);
    auVar4 = vpshufb_avx(auVar48 ^ auVar34 ^ auVar36 ^ auVar4,_DAT_0012dce0);
    return (int)((auVar4 ^ local_c8) == *_aad);
  }
  auVar8 = *pauVar24;
  pauVar24 = pauVar24 + 1;
  *(undefined1 (*) [16])output = auVar49 ^ auVar8;
  output = (void *)((long)output + 0x10);
  inlen = inlen - 0x10;
switchD_0010a43c_caseD_1:
  auVar49 = auVar35;
  if (inlen < 0x11) goto LAB_0010a506;
  auVar49 = *pauVar24;
  pauVar24 = pauVar24 + 1;
  *(undefined1 (*) [16])output = auVar35 ^ auVar49;
  output = (void *)((long)output + 0x10);
  inlen = inlen - 0x10;
switchD_0010a43c_caseD_2:
  auVar49 = auVar41;
  if (inlen < 0x11) goto LAB_0010a506;
  auVar49 = *pauVar24;
  pauVar24 = pauVar24 + 1;
  *(undefined1 (*) [16])output = auVar41 ^ auVar49;
  output = (void *)((long)output + 0x10);
  inlen = inlen - 0x10;
switchD_0010a43c_caseD_3:
  auVar49 = auVar43;
  if (inlen < 0x11) goto LAB_0010a506;
  auVar49 = *pauVar24;
  pauVar24 = pauVar24 + 1;
  *(undefined1 (*) [16])output = auVar43 ^ auVar49;
  output = (void *)((long)output + 0x10);
  inlen = inlen - 0x10;
switchD_0010a43c_caseD_4:
  auVar49 = auVar45;
  if (inlen < 0x11) goto LAB_0010a506;
  auVar49 = *pauVar24;
  pauVar24 = pauVar24 + 1;
  *(undefined1 (*) [16])output = auVar45 ^ auVar49;
  output = (void *)((long)output + 0x10);
  inlen = inlen - 0x10;
switchD_0010a43c_caseD_5:
  auVar49 = auVar50;
  if (inlen < 0x11) goto LAB_0010a506;
  auVar48 = *pauVar24;
  pauVar24 = pauVar24 + 1;
  *(undefined1 (*) [16])output = auVar50 ^ auVar48;
  output = (void *)((long)output + 0x10);
  inlen = inlen - 0x10;
  lVar28 = 0;
  goto LAB_00109e21;
}

Assistant:

int ptls_fusion_aesgcm_decrypt(ptls_fusion_aesgcm_context_t *_ctx, void *output, const void *input, size_t inlen, __m128i ctr,
                               const void *_aad, size_t aadlen, const void *tag)
{
    struct ptls_fusion_aesgcm_context128 *ctx = (void *)_ctx;
    __m128i ek0 = _mm_setzero_si128(), bits0, bits1 = _mm_setzero_si128(), bits2 = _mm_setzero_si128(), bits3 = _mm_setzero_si128(),
            bits4 = _mm_setzero_si128(), bits5 = _mm_setzero_si128();
    struct ptls_fusion_gfmul_state128 gstate = {0};
    __m128i gdatabuf[6];
    __m128i ac = _mm_shuffle_epi8(_mm_set_epi32(0, (int)aadlen * 8, 0, (int)inlen * 8), byteswap128);
    struct ptls_fusion_aesgcm_ghash_precompute128 *ghash_precompute = ctx->ghash + (aadlen + 15) / 16 + (inlen + 15) / 16 + 1;

    const __m128i *gdata; // points to the elements fed into GHASH
    size_t gdata_cnt;

    const __m128i *src_ghash = input, *src_aes = input, *aad = _aad;
    __m128i *dst = output;
    size_t nondata_aes_cnt = 0, src_ghashlen = inlen, src_aeslen = inlen;

    /* schedule ek0 and suppkey */
    ctr = _mm_add_epi64(ctr, one8);
    bits0 = _mm_xor_si128(_mm_shuffle_epi8(ctr, byteswap128), ctx->super.ecb.keys.m128[0]);
    ++nondata_aes_cnt;

#define STATE_IS_FIRST_RUN 0x1
#define STATE_GHASH_HAS_MORE 0x2
    int state = STATE_IS_FIRST_RUN | STATE_GHASH_HAS_MORE;

    /* the main loop */
    while (1) {

        /* setup gdata */
        if (PTLS_UNLIKELY(aadlen != 0)) {
            gdata = gdatabuf;
            gdata_cnt = 0;
            while (gdata_cnt < 6) {
                if (aadlen < 16) {
                    if (aadlen != 0) {
                        gdatabuf[gdata_cnt++] = loadn128(aad, aadlen);
                        aadlen = 0;
                        ++nondata_aes_cnt;
                    }
                    goto GdataFillSrc;
                }
                gdatabuf[gdata_cnt++] = _mm_loadu_si128(aad++);
                aadlen -= 16;
                ++nondata_aes_cnt;
            }
        } else if (PTLS_LIKELY(src_ghashlen >= 6 * 16)) {
            gdata = src_ghash;
            gdata_cnt = 6;
            src_ghash += 6;
            src_ghashlen -= 6 * 16;
        } else {
            gdata = gdatabuf;
            gdata_cnt = 0;
        GdataFillSrc:
            while (gdata_cnt < 6) {
                if (src_ghashlen < 16) {
                    if (src_ghashlen != 0) {
                        gdatabuf[gdata_cnt++] = loadn128(src_ghash, src_ghashlen);
                        src_ghash = (__m128i *)((uint8_t *)src_ghash + src_ghashlen);
                        src_ghashlen = 0;
                    }
                    if (gdata_cnt < 6 && (state & STATE_GHASH_HAS_MORE) != 0) {
                        gdatabuf[gdata_cnt++] = ac;
                        state &= ~STATE_GHASH_HAS_MORE;
                    }
                    break;
                }
                gdatabuf[gdata_cnt++] = _mm_loadu_si128(src_ghash++);
                src_ghashlen -= 16;
            }
        }

        /* setup aes bits */
        if (PTLS_LIKELY(nondata_aes_cnt == 0))
            goto InitAllBits;
        switch (nondata_aes_cnt) {
#define INIT_BITS(n, keys)                                                                                                         \
    case n:                                                                                                                        \
        ctr = _mm_add_epi64(ctr, one8);                                                                                            \
        bits##n = _mm_xor_si128(_mm_shuffle_epi8(ctr, byteswap128), keys.m128[0]);
        InitAllBits:
            INIT_BITS(0, ctx->super.ecb.keys);
            INIT_BITS(1, ctx->super.ecb.keys);
            INIT_BITS(2, ctx->super.ecb.keys);
            INIT_BITS(3, ctx->super.ecb.keys);
            INIT_BITS(4, ctx->super.ecb.keys);
            INIT_BITS(5, ctx->super.ecb.keys);
#undef INIT_BITS
        }

        { /* run aes and ghash */
#define AESECB6_UPDATE(i)                                                                                                          \
    do {                                                                                                                           \
        __m128i k = ctx->super.ecb.keys.m128[i];                                                                                   \
        bits0 = _mm_aesenc_si128(bits0, k);                                                                                        \
        bits1 = _mm_aesenc_si128(bits1, k);                                                                                        \
        bits2 = _mm_aesenc_si128(bits2, k);                                                                                        \
        bits3 = _mm_aesenc_si128(bits3, k);                                                                                        \
        bits4 = _mm_aesenc_si128(bits4, k);                                                                                        \
        bits5 = _mm_aesenc_si128(bits5, k);                                                                                        \
    } while (0)

            size_t aesi;
            for (aesi = 1; aesi <= gdata_cnt; ++aesi) {
                AESECB6_UPDATE(aesi);
                gfmul_nextstep128(&gstate, _mm_loadu_si128(gdata++), --ghash_precompute);
            }
            for (; aesi < ctx->super.ecb.rounds; ++aesi)
                AESECB6_UPDATE(aesi);
            __m128i k = ctx->super.ecb.keys.m128[aesi];
            bits0 = _mm_aesenclast_si128(bits0, k);
            bits1 = _mm_aesenclast_si128(bits1, k);
            bits2 = _mm_aesenclast_si128(bits2, k);
            bits3 = _mm_aesenclast_si128(bits3, k);
            bits4 = _mm_aesenclast_si128(bits4, k);
            bits5 = _mm_aesenclast_si128(bits5, k);

#undef AESECB6_UPDATE
        }

        /* apply aes bits */
        if (PTLS_LIKELY(nondata_aes_cnt == 0 && src_aeslen >= 6 * 16)) {
#define APPLY(i) _mm_storeu_si128(dst + i, _mm_xor_si128(_mm_loadu_si128(src_aes + i), bits##i))
            APPLY(0);
            APPLY(1);
            APPLY(2);
            APPLY(3);
            APPLY(4);
            APPLY(5);
#undef APPLY
            dst += 6;
            src_aes += 6;
            src_aeslen -= 6 * 16;
        } else {
            if ((state & STATE_IS_FIRST_RUN) != 0) {
                ek0 = bits0;
                state &= ~STATE_IS_FIRST_RUN;
            }
            switch (nondata_aes_cnt) {
#define APPLY(i)                                                                                                                   \
    case i:                                                                                                                        \
        if (PTLS_LIKELY(src_aeslen > 16)) {                                                                                        \
            _mm_storeu_si128(dst++, _mm_xor_si128(_mm_loadu_si128(src_aes++), bits##i));                                           \
            src_aeslen -= 16;                                                                                                      \
        } else {                                                                                                                   \
            bits0 = bits##i;                                                                                                       \
            goto Finish;                                                                                                           \
        }
                APPLY(0);
                APPLY(1);
                APPLY(2);
                APPLY(3);
                APPLY(4);
                APPLY(5);
#undef APPLY
            }
            nondata_aes_cnt = 0;
        }
    }

Finish:
    if (src_aeslen == 16) {
        _mm_storeu_si128(dst, _mm_xor_si128(_mm_loadu_si128(src_aes), bits0));
    } else if (src_aeslen != 0) {
        storen128(dst, src_aeslen, _mm_xor_si128(loadn128(src_aes, src_aeslen), bits0));
    }

    assert((state & STATE_IS_FIRST_RUN) == 0);

    /* the only case where AES operation is complete and GHASH is not is when the application of AC is remaining */
    if ((state & STATE_GHASH_HAS_MORE) != 0) {
        assert(ghash_precompute - 1 == ctx->ghash);
        gfmul_nextstep128(&gstate, ac, --ghash_precompute);
    }

    gfmul_reduce128(&gstate);
    __m128i calctag = gfmul_get_tag128(&gstate, ek0);

    return _mm_movemask_epi8(_mm_cmpeq_epi8(calctag, _mm_loadu_si128(tag))) == 0xffff;

#undef STATE_IS_FIRST_RUN
#undef STATE_GHASH_HAS_MORE
}